

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  char cVar1;
  uint uVar2;
  StkId pTVar3;
  char *pcVar4;
  GCObject *pGVar5;
  undefined8 *local_118;
  Value *local_f8;
  int *local_d8;
  undefined4 *local_c0;
  long *local_a8;
  char local_8b;
  char local_8a;
  undefined1 local_89;
  char local_88 [5];
  char buff_2 [3];
  char buff_1 [40];
  TValue *i_o_2;
  TValue *i_o_1;
  char *pcStack_40;
  char buff [2];
  char *s;
  TValue *i_o;
  char *e;
  int n;
  __va_list_tag *argp_local;
  char *fmt_local;
  lua_State *L_local;
  
  e._4_4_ = 1;
  pushstr(L,"");
  argp_local = (__va_list_tag *)fmt;
  while (pcVar4 = strchr((char *)argp_local,0x25), pcVar4 != (char *)0x0) {
    pTVar3 = L->top;
    pGVar5 = (GCObject *)luaS_newlstr(L,(char *)argp_local,(long)pcVar4 - (long)argp_local);
    (pTVar3->value).gc = pGVar5;
    pTVar3->tt = 4;
    if ((long)L->stack_last - (long)L->top < 0x11) {
      luaD_growstack(L,1);
    }
    L->top = L->top + 1;
    cVar1 = pcVar4[1];
    if (cVar1 == '%') {
      pushstr(L,"%");
    }
    else if (cVar1 == 'c') {
      uVar2 = argp->gp_offset;
      if (uVar2 < 0x29) {
        local_c0 = (undefined4 *)((long)(int)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        local_c0 = (undefined4 *)argp->overflow_arg_area;
        argp->overflow_arg_area = local_c0 + 2;
      }
      i_o_1._6_1_ = (undefined1)*local_c0;
      i_o_1._7_1_ = 0;
      pushstr(L,(char *)((long)&i_o_1 + 6));
    }
    else if (cVar1 == 'd') {
      pTVar3 = L->top;
      uVar2 = argp->gp_offset;
      if (uVar2 < 0x29) {
        local_d8 = (int *)((long)(int)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        local_d8 = (int *)argp->overflow_arg_area;
        argp->overflow_arg_area = local_d8 + 2;
      }
      (pTVar3->value).n = (double)*local_d8;
      pTVar3->tt = 3;
      if ((long)L->stack_last - (long)L->top < 0x11) {
        luaD_growstack(L,1);
      }
      L->top = L->top + 1;
    }
    else if (cVar1 == 'f') {
      pTVar3 = L->top;
      uVar2 = argp->fp_offset;
      if (uVar2 < 0xa1) {
        local_f8 = (Value *)((long)(int)uVar2 + (long)argp->reg_save_area);
        argp->fp_offset = uVar2 + 0x10;
      }
      else {
        local_f8 = (Value *)argp->overflow_arg_area;
        argp->overflow_arg_area = local_f8 + 1;
      }
      pTVar3->value = *local_f8;
      pTVar3->tt = 3;
      if ((long)L->stack_last - (long)L->top < 0x11) {
        luaD_growstack(L,1);
      }
      L->top = L->top + 1;
    }
    else if (cVar1 == 'p') {
      uVar2 = argp->gp_offset;
      if (uVar2 < 0x29) {
        local_118 = (undefined8 *)((long)(int)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        local_118 = (undefined8 *)argp->overflow_arg_area;
        argp->overflow_arg_area = local_118 + 1;
      }
      sprintf(local_88,"%p",*local_118);
      pushstr(L,local_88);
    }
    else if (cVar1 == 's') {
      uVar2 = argp->gp_offset;
      if (uVar2 < 0x29) {
        local_a8 = (long *)((long)(int)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        local_a8 = (long *)argp->overflow_arg_area;
        argp->overflow_arg_area = local_a8 + 1;
      }
      pcStack_40 = (char *)*local_a8;
      if (pcStack_40 == (char *)0x0) {
        pcStack_40 = "(null)";
      }
      pushstr(L,pcStack_40);
    }
    else {
      local_8b = '%';
      local_8a = pcVar4[1];
      local_89 = 0;
      pushstr(L,&local_8b);
    }
    e._4_4_ = e._4_4_ + 2;
    argp_local = (__va_list_tag *)(pcVar4 + 2);
  }
  pushstr(L,(char *)argp_local);
  luaV_concat(L,e._4_4_ + 1,(int)((long)L->top - (long)L->base >> 4) + -1);
  L->top = L->top + -(long)e._4_4_;
  return (char *)&((L->top[-1].value.gc)->h).array;
}

Assistant:

static const char*luaO_pushvfstring(lua_State*L,const char*fmt,va_list argp){
int n=1;
pushstr(L,"");
for(;;){
const char*e=strchr(fmt,'%');
if(e==NULL)break;
setsvalue(L,L->top,luaS_newlstr(L,fmt,e-fmt));
incr_top(L);
switch(*(e+1)){
case's':{
const char*s=va_arg(argp,char*);
if(s==NULL)s="(null)";
pushstr(L,s);
break;
}
case'c':{
char buff[2];
buff[0]=cast(char,va_arg(argp,int));
buff[1]='\0';
pushstr(L,buff);
break;
}
case'd':{
setnvalue(L->top,cast_num(va_arg(argp,int)));
incr_top(L);
break;
}
case'f':{
setnvalue(L->top,cast_num(va_arg(argp,l_uacNumber)));
incr_top(L);
break;
}
case'p':{
char buff[4*sizeof(void*)+8];
sprintf(buff,"%p",va_arg(argp,void*));
pushstr(L,buff);
break;
}
case'%':{
pushstr(L,"%");
break;
}
default:{
char buff[3];
buff[0]='%';
buff[1]=*(e+1);
buff[2]='\0';
pushstr(L,buff);
break;
}
}
n+=2;
fmt=e+2;
}
pushstr(L,fmt);
luaV_concat(L,n+1,cast_int(L->top-L->base)-1);
L->top-=n;
return svalue(L->top-1);
}